

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::StringMaker<char[18],void>::convert_abi_cxx11_(char *str)

{
  char *in_RSI;
  string *in_RDI;
  string *e;
  allocator local_31;
  string local_30 [48];
  
  e = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,in_RSI,&local_31);
  Detail::stringify<std::__cxx11::string>(e);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return in_RDI;
}

Assistant:

static std::string convert(char const* str) {
            return ::Catch::Detail::stringify(std::string{ str });
        }